

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void emulator_new_cold_2(void)

{
  fprintf(_stderr,"%s:%d: ",
          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",0x1329);
  fwrite("File is empty.\n",0xf,1,_stderr);
  return;
}

Assistant:

static Result set_rom_file_data(Emulator* e, const FileData* file_data) {
  CHECK_MSG(file_data->size > 0, "File is empty.\n");
  CHECK_MSG((file_data->size & (MINIMUM_ROM_SIZE - 1)) == 0,
            "File size (%ld) should be a multiple of minimum rom size (%ld).\n",
            (long)file_data->size, (long)MINIMUM_ROM_SIZE);
  e->file_data = *file_data;
  return OK;
  ON_ERROR_RETURN;
}